

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyPaletted<cBGRA,bReverseSubtract>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  BYTE BVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  byte *pbVar10;
  
  uVar6 = 0;
  uVar4 = (ulong)(uint)srcwidth;
  if (srcwidth < 1) {
    uVar4 = uVar6;
  }
  uVar3 = (ulong)(uint)srcheight;
  if (srcheight < 1) {
    uVar3 = uVar6;
  }
  iVar5 = 0;
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    lVar9 = (long)iVar5;
    pbVar10 = patch;
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      bVar1 = *pbVar10;
      BVar2 = palette[bVar1].field_0.field_0.a;
      if (BVar2 != '\0') {
        iVar7 = (uint)palette[bVar1].field_0.field_0.r * inf->alpha +
                (uint)buffer[uVar8 * 4 + lVar9 + 2] * -0x10000;
        if (iVar7 >> 0x10 < 1) {
          iVar7 = 0;
        }
        buffer[uVar8 * 4 + lVar9 + 2] = (BYTE)((uint)iVar7 >> 0x10);
        iVar7 = (uint)palette[bVar1].field_0.field_0.g * inf->alpha +
                (uint)buffer[uVar8 * 4 + lVar9 + 1] * -0x10000;
        if (iVar7 >> 0x10 < 1) {
          iVar7 = 0;
        }
        buffer[uVar8 * 4 + lVar9 + 1] = (BYTE)((uint)iVar7 >> 0x10);
        iVar7 = (uint)palette[bVar1].field_0.field_0.b * inf->alpha +
                (uint)buffer[uVar8 * 4 + lVar9] * -0x10000;
        if (iVar7 >> 0x10 < 1) {
          iVar7 = 0;
        }
        buffer[uVar8 * 4 + lVar9] = (BYTE)((uint)iVar7 >> 0x10);
        buffer[uVar8 * 4 + lVar9 + 3] = BVar2;
      }
      pbVar10 = pbVar10 + step_x;
    }
    iVar5 = iVar5 + Pitch;
    patch = patch + step_y;
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}